

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O1

seed_t lest::seed(text *opt,text *arg)

{
  pointer pcVar1;
  int iVar2;
  long *plVar3;
  seed_t sVar4;
  runtime_error *this;
  long *plVar5;
  long lVar6;
  size_type *psVar7;
  long *plVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  long *local_70 [2];
  long local_60 [2];
  long *local_50;
  ulong local_48;
  long local_40 [2];
  
  pcVar1 = (arg->_M_dataplus)._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + arg->_M_string_length);
  plVar5 = (long *)((long)local_50 + local_48);
  plVar3 = local_50;
  if (0 < (long)local_48 >> 2) {
    plVar3 = (long *)((long)local_50 + (local_48 & 0xfffffffffffffffc));
    lVar6 = ((long)local_48 >> 2) + 1;
    plVar8 = (long *)((long)local_50 + 3);
    do {
      if ((int)*(char *)((long)plVar8 + -3) - 0x3aU < 0xfffffff6) {
        plVar8 = (long *)((long)plVar8 + -3);
        goto LAB_00131c7d;
      }
      if ((int)*(char *)((long)plVar8 + -2) - 0x3aU < 0xfffffff6) {
        plVar8 = (long *)((long)plVar8 + -2);
        goto LAB_00131c7d;
      }
      if ((int)*(char *)((long)plVar8 + -1) - 0x3aU < 0xfffffff6) {
        plVar8 = (long *)((long)plVar8 + -1);
        goto LAB_00131c7d;
      }
      if ((int)(char)*plVar8 - 0x3aU < 0xfffffff6) goto LAB_00131c7d;
      lVar6 = lVar6 + -1;
      plVar8 = (long *)((long)plVar8 + 4);
    } while (1 < lVar6);
  }
  lVar6 = (long)plVar5 - (long)plVar3;
  if (lVar6 != 1) {
    if (lVar6 != 2) {
      plVar8 = plVar5;
      if ((lVar6 != 3) || (plVar8 = plVar3, (int)(char)*plVar3 - 0x3aU < 0xfffffff6))
      goto LAB_00131c7d;
      plVar3 = (long *)((long)plVar3 + 1);
    }
    plVar8 = plVar3;
    if ((int)(char)*plVar3 - 0x3aU < 0xfffffff6) goto LAB_00131c7d;
    plVar3 = (long *)((long)plVar3 + 1);
  }
  plVar8 = plVar3;
  if (0xfffffff5 < (int)(char)*plVar3 - 0x3aU) {
    plVar8 = plVar5;
  }
LAB_00131c7d:
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if (plVar8 == plVar5) {
    pcVar1 = (arg->_M_dataplus)._M_p;
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,pcVar1,pcVar1 + arg->_M_string_length);
    lVar6 = strtol((char *)local_70[0],(char **)0x0,10);
    sVar4 = (seed_t)(int)lVar6;
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)arg);
    if (iVar2 != 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_b0,"expecting \'time\' or positive number with option \'",opt);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
      local_f0._M_dataplus._M_p = (pointer)*plVar5;
      psVar7 = (size_type *)(plVar5 + 2);
      if ((size_type *)local_f0._M_dataplus._M_p == psVar7) {
        local_f0.field_2._M_allocated_capacity = *psVar7;
        local_f0.field_2._8_8_ = plVar5[3];
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      }
      else {
        local_f0.field_2._M_allocated_capacity = *psVar7;
      }
      local_f0._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::operator+(&local_90,&local_f0,arg);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_90);
      local_d0 = (long *)*plVar5;
      plVar3 = plVar5 + 2;
      if (local_d0 == plVar3) {
        local_c0 = *plVar3;
        lStack_b8 = plVar5[3];
        local_d0 = &local_c0;
      }
      else {
        local_c0 = *plVar3;
      }
      local_c8 = plVar5[1];
      *plVar5 = (long)plVar3;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::runtime_error::runtime_error(this,(string *)&local_d0);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    sVar4 = std::chrono::_V2::system_clock::now();
  }
  return sVar4;
}

Assistant:

inline seed_t seed( text opt, text arg )
{
    if ( is_number( arg ) )
        return static_cast<seed_t>( lest::stoi( arg ) );

    if ( arg == "time" )
        return static_cast<seed_t>( std::chrono::high_resolution_clock::now().time_since_epoch().count() );

    throw std::runtime_error( "expecting 'time' or positive number with option '" + opt + "', got '" + arg + "' (try option --help)" );
}